

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Skeleton::saveJoint
          (Skeleton *this,XMLDocument *xmlDoc,XMLElement *parentNode,Joint *joint)

{
  bool bVar1;
  XMLElement *addThis;
  XMLElement *pXVar2;
  Spline<CMU462::Vector3D> *pSVar3;
  reference ppVar4;
  XMLElement *pXVar5;
  reference ppJVar6;
  Joint *j;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *__range2_3;
  XMLElement *pChildren;
  XMLElement *pListElement_2;
  pair<const_double,_CMU462::Vector3D> *item_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
  *__range2_2;
  XMLElement *pListElement_1;
  pair<const_double,_CMU462::Vector3D> *item_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
  *__range2_1;
  XMLElement *pListElement;
  pair<const_double,_CMU462::Vector3D> *item;
  const_iterator __end2;
  const_iterator __begin2;
  map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
  *__range2;
  XMLElement *pElement;
  XMLElement *pJoint;
  Joint *joint_local;
  XMLElement *parentNode_local;
  XMLDocument *xmlDoc_local;
  Skeleton *this_local;
  
  addThis = tinyxml2::XMLDocument::NewElement(xmlDoc,"Joint");
  tinyxml2::XMLNode::InsertEndChild(&parentNode->super_XMLNode,&addThis->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Axis");
  tinyxml2::XMLElement::SetAttribute(pXVar2,"x",(joint->axis).x);
  tinyxml2::XMLElement::SetAttribute(pXVar2,"y",(joint->axis).y);
  tinyxml2::XMLElement::SetAttribute(pXVar2,"z",(joint->axis).z);
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"RenderScale");
  tinyxml2::XMLElement::SetAttribute(pXVar2,"val",joint->renderScale);
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"CapsuleRadius");
  tinyxml2::XMLElement::SetAttribute(pXVar2,"val",joint->capsuleRadius);
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Positions");
  pSVar3 = &(joint->super_SceneObject).positions;
  __end2 = std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::begin(&pSVar3->knots);
  item = (pair<const_double,_CMU462::Vector3D> *)
         std::
         map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
         ::end(&pSVar3->knots);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&item);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_double,_CMU462::Vector3D>_>::operator*
                       (&__end2);
    pXVar5 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Knot");
    tinyxml2::XMLElement::SetAttribute(pXVar5,"Time",ppVar4->first);
    tinyxml2::XMLElement::SetAttribute(pXVar5,"x",(ppVar4->second).x);
    tinyxml2::XMLElement::SetAttribute(pXVar5,"y",(ppVar4->second).y);
    tinyxml2::XMLElement::SetAttribute(pXVar5,"z",(ppVar4->second).z);
    tinyxml2::XMLNode::InsertEndChild(&pXVar2->super_XMLNode,&pXVar5->super_XMLNode);
    std::_Rb_tree_const_iterator<std::pair<const_double,_CMU462::Vector3D>_>::operator++(&__end2);
  }
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Rotations");
  pSVar3 = &(joint->super_SceneObject).rotations;
  __end2_1 = std::
             map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
             ::begin(&pSVar3->knots);
  item_1 = (pair<const_double,_CMU462::Vector3D> *)
           std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::end(&pSVar3->knots);
  while( true ) {
    bVar1 = std::operator!=(&__end2_1,(_Self *)&item_1);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_double,_CMU462::Vector3D>_>::operator*
                       (&__end2_1);
    pXVar5 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Knot");
    tinyxml2::XMLElement::SetAttribute(pXVar5,"Time",ppVar4->first);
    tinyxml2::XMLElement::SetAttribute(pXVar5,"x",(ppVar4->second).x);
    tinyxml2::XMLElement::SetAttribute(pXVar5,"y",(ppVar4->second).y);
    tinyxml2::XMLElement::SetAttribute(pXVar5,"z",(ppVar4->second).z);
    tinyxml2::XMLNode::InsertEndChild(&pXVar2->super_XMLNode,&pXVar5->super_XMLNode);
    std::_Rb_tree_const_iterator<std::pair<const_double,_CMU462::Vector3D>_>::operator++(&__end2_1);
  }
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Scales");
  pSVar3 = &(joint->super_SceneObject).scales;
  __end2_2 = std::
             map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
             ::begin(&pSVar3->knots);
  item_2 = (pair<const_double,_CMU462::Vector3D> *)
           std::
           map<double,_CMU462::Vector3D,_std::less<double>,_std::allocator<std::pair<const_double,_CMU462::Vector3D>_>_>
           ::end(&pSVar3->knots);
  while( true ) {
    bVar1 = std::operator!=(&__end2_2,(_Self *)&item_2);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_double,_CMU462::Vector3D>_>::operator*
                       (&__end2_2);
    pXVar5 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Knot");
    tinyxml2::XMLElement::SetAttribute(pXVar5,"Time",ppVar4->first);
    tinyxml2::XMLElement::SetAttribute(pXVar5,"x",(ppVar4->second).x);
    tinyxml2::XMLElement::SetAttribute(pXVar5,"y",(ppVar4->second).y);
    tinyxml2::XMLElement::SetAttribute(pXVar5,"z",(ppVar4->second).z);
    tinyxml2::XMLNode::InsertEndChild(&pXVar2->super_XMLNode,&pXVar5->super_XMLNode);
    std::_Rb_tree_const_iterator<std::pair<const_double,_CMU462::Vector3D>_>::operator++(&__end2_2);
  }
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  pXVar2 = tinyxml2::XMLDocument::NewElement(xmlDoc,"Children");
  tinyxml2::XMLNode::InsertEndChild(&addThis->super_XMLNode,&pXVar2->super_XMLNode);
  __end2_3 = std::
             vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
             begin(&joint->kids);
  j = (Joint *)std::
               vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
               ::end(&joint->kids);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_3,
                       (__normal_iterator<CMU462::DynamicScene::Joint_*const_*,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                        *)&j);
    if (!bVar1) break;
    ppJVar6 = __gnu_cxx::
              __normal_iterator<CMU462::DynamicScene::Joint_*const_*,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
              ::operator*(&__end2_3);
    saveJoint(this,xmlDoc,pXVar2,*ppJVar6);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint_*const_*,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
    ::operator++(&__end2_3);
  }
  return;
}

Assistant:

void Skeleton::saveJoint(XMLDocument* xmlDoc, XMLElement* parentNode, const Joint * joint)
   {
     XMLElement* pJoint = xmlDoc->NewElement("Joint");
     parentNode->InsertEndChild(pJoint);

     XMLElement* pElement = xmlDoc->NewElement("Axis");
     pElement->SetAttribute("x", joint->axis.x);
     pElement->SetAttribute("y", joint->axis.y);
     pElement->SetAttribute("z", joint->axis.z);
     pJoint->InsertEndChild(pElement);

     pElement = xmlDoc->NewElement("RenderScale");
     pElement->SetAttribute("val", joint->renderScale);
     pJoint->InsertEndChild(pElement);

     pElement = xmlDoc->NewElement("CapsuleRadius");
     pElement->SetAttribute("val", joint->capsuleRadius);
     pJoint->InsertEndChild(pElement);

     // positions
     pElement = xmlDoc->NewElement("Positions");
     for (const auto & item : joint->positions.knots)
     {
       XMLElement * pListElement = xmlDoc->NewElement("Knot");
       pListElement->SetAttribute("Time", item.first);
       pListElement->SetAttribute("x", item.second.x);
       pListElement->SetAttribute("y", item.second.y);
       pListElement->SetAttribute("z", item.second.z);

       pElement->InsertEndChild(pListElement);
     }
     pJoint->InsertEndChild(pElement);

     // rotations
     pElement = xmlDoc->NewElement("Rotations");
     for (const auto & item : joint->rotations.knots)
     {
       XMLElement * pListElement = xmlDoc->NewElement("Knot");
       pListElement->SetAttribute("Time", item.first);
       pListElement->SetAttribute("x", item.second.x);
       pListElement->SetAttribute("y", item.second.y);
       pListElement->SetAttribute("z", item.second.z);

       pElement->InsertEndChild(pListElement);
     }
     pJoint->InsertEndChild(pElement);

     // scales
     pElement = xmlDoc->NewElement("Scales");
     for (const auto & item : joint->scales.knots)
     {
       XMLElement * pListElement = xmlDoc->NewElement("Knot");
       pListElement->SetAttribute("Time", item.first);
       pListElement->SetAttribute("x", item.second.x);
       pListElement->SetAttribute("y", item.second.y);
       pListElement->SetAttribute("z", item.second.z);

       pElement->InsertEndChild(pListElement);
     }
     pJoint->InsertEndChild(pElement);

     XMLElement* pChildren = xmlDoc->NewElement("Children");
     pJoint->InsertEndChild(pChildren);
     for (Joint* j : joint->kids)
     {
       saveJoint(xmlDoc, pChildren, j);
     }
   }